

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_i_refvec.h
# Opt level: O2

void __thiscall TNT::i_refvec<interval>::destroy(i_refvec<interval> *this)

{
  if (this->ref_count_ != (int *)0x0) {
    operator_delete(this->ref_count_,4);
    if (this->data_ != (interval *)0x0) {
      operator_delete__(this->data_);
    }
    this->data_ = (interval *)0x0;
  }
  return;
}

Assistant:

void i_refvec<T>::destroy()
{
	if (ref_count_ != NULL)
	{
#ifdef TNT_DEBUG
		std::cout << "destorying data... \n";
#endif
		delete ref_count_;

#ifdef TNT_DEBUG
		std::cout << "deleted ref_count_ ...\n";
#endif
		if (data_ != NULL)
			delete []data_;
#ifdef TNT_DEBUG
		std::cout << "deleted data_[] ...\n";
#endif
		data_ = NULL;
	}
}